

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryImagesLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::LibraryImagesLoader14::begin__image
          (LibraryImagesLoader14 *this,image__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  bool bVar2;
  image__AttributeData attrData;
  uint local_50 [2];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_48 = *(undefined8 *)(in_RSI + 2);
  local_38 = *(undefined8 *)(in_RSI + 4);
  local_40 = 0;
  local_30 = *(undefined8 *)(in_RSI + 6);
  local_18 = *(undefined8 *)(in_RSI + 0xc);
  bVar2 = (*in_RSI & 1) == 1;
  if (bVar2) {
    local_28 = *(undefined8 *)(in_RSI + 8);
  }
  local_50[0] = (uint)bVar2;
  if ((*in_RSI & 2) == 2) {
    local_20 = *(undefined8 *)(in_RSI + 10);
    local_50[0] = local_50[0] | 2;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x78))(*(long **)(in_RDI + 0x18),local_50);
  return (bool)(bVar1 & 1);
}

Assistant:

bool LibraryImagesLoader14::begin__image( const COLLADASaxFWL14::image__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__image(attributeData));
COLLADASaxFWL::image__AttributeData attrData;
attrData.present_attributes = 0;
attrData.id = attributeData.id;
attrData.name = attributeData.name;
attrData.sid = 0;
attrData.format = attributeData.format;
attrData.depth = attributeData.depth;
if ( (attributeData.present_attributes & COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT) == COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT ) {
    attrData.height = attributeData.height;
    attrData.present_attributes |= COLLADASaxFWL::image__AttributeData::ATTRIBUTE_HEIGHT_PRESENT;
}
if ( (attributeData.present_attributes & COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT) == COLLADASaxFWL14::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT ) {
    attrData.width = attributeData.width;
    attrData.present_attributes |= COLLADASaxFWL::image__AttributeData::ATTRIBUTE_WIDTH_PRESENT;
}
return mLoader->begin__image(attrData);
}